

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

int __thiscall
BattleWithLandlord::AlphaBeta
          (BattleWithLandlord *this,int depth,int alpha,int beta,
          list<CardStyle,_std::allocator<CardStyle>_> *pv)

{
  CardStyle *this_00;
  int iVar1;
  int iVar2;
  pointer __x;
  vector<CardStyle,_std::allocator<CardStyle>_> strategies;
  list<CardStyle,_std::allocator<CardStyle>_> line;
  CardStyle last;
  
  iVar2 = 0;
  if (this->_stopsearch == false) {
    GenStrategy(&strategies,this);
    if (((this->_cards[this->_side]._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
        (*(long *)((long)this + (1 - (long)this->_side) * 0x30 + 0x98) == 0)) ||
       ((depth < 1 &&
        (0x40 < (ulong)((long)strategies.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)strategies.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>.
                             _M_impl.super__Vector_impl_data._M_start))))) {
      iVar1 = Evaluate(this);
      iVar2 = -iVar1;
      if (this->_side == 0) {
        iVar2 = iVar1;
      }
    }
    else {
      line.super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&line;
      line.super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node._M_size = 0;
      this_00 = &this->_last;
      line.super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           line.super__List_base<CardStyle,_std::allocator<CardStyle>_>._M_impl._M_node.
           super__List_node_base._M_next;
      CardStyle::CardStyle(&last,this_00);
      __x = strategies.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
            super__Vector_impl_data._M_start;
      do {
        iVar2 = alpha;
        if (__x == strategies.super__Vector_base<CardStyle,_std::allocator<CardStyle>_>._M_impl.
                   super__Vector_impl_data._M_finish) break;
        Move(this,&__x->pattern);
        CardStyle::operator=(this_00,__x);
        iVar2 = AlphaBeta(this,depth + -1,-beta,-alpha,&line);
        Unmove(this,&__x->pattern);
        iVar1 = -iVar2;
        if (beta < iVar1) goto LAB_0010c855;
        if (SBORROW4(alpha,iVar1) != alpha + iVar2 < 0) {
          std::__cxx11::list<CardStyle,_std::allocator<CardStyle>_>::operator=(pv,&line);
          std::__cxx11::list<CardStyle,_std::allocator<CardStyle>_>::push_front(pv,__x);
          alpha = iVar1;
        }
        __x = __x + 1;
        iVar2 = alpha;
      } while (alpha < 0x7149);
      beta = iVar2;
      CardStyle::operator=(this_00,&last);
LAB_0010c855:
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&last.pattern._M_t);
      std::__cxx11::_List_base<CardStyle,_std::allocator<CardStyle>_>::_M_clear
                (&line.super__List_base<CardStyle,_std::allocator<CardStyle>_>);
      iVar2 = beta;
    }
    std::vector<CardStyle,_std::allocator<CardStyle>_>::~vector(&strategies);
  }
  return iVar2;
}

Assistant:

int BattleWithLandlord::AlphaBeta(int depth, int alpha, int beta, list<CardStyle> &pv) {
    {
        // std::lock_guard<std::mutex> lck(_mtx);
        if (_stopsearch) return 0;
    }

#if USE_HASHMAP
    if (_hash.find(_cards[_side], _cards[1-_side], _last, depth)) {
        auto val = _hash.get();
        pv = val.path;
        return val.score;
        // else continue alpha-beta search
    }
#endif

    auto strategies = GenStrategy();

    if (!_cards[_side].size() || !_cards[1-_side].size() || 
        depth <= 0 && strategies.size() > 1) {
        
        auto v = Evaluate();
        int score = _side ? -v: v;
        return score;
    }

    int value;
    list<CardStyle> line;


    CardStyle last = _last;
    for (auto &s: strategies) {
        Move(s.pattern);
        _last = s;
        value = -AlphaBeta(depth-1, -beta, -alpha, line);
        Unmove(s.pattern);

        if (value > beta) {
            return beta;
        }
        if (value > alpha) {
            alpha = value;
            pv = line;
            pv.push_front(s);
        }
// #if !USE_HASHMAP
        if (alpha > WIN_SCORE) break;
// #endif
    }
#if USE_HASHMAP
    if (depth == _max_depth && (alpha > WIN_SCORE || alpha < -WIN_SCORE )) {
        _hash.put(_cards[_side], _cards[1-_side], last, pv, depth, alpha);
    } 
#endif

    _last = last;
    return alpha; 
}